

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int * Dau_DsdComputeMatches(char *p)

{
  int local_50;
  int local_4c;
  int nNested;
  int v;
  int pNested [12];
  char *p_local;
  
  local_50 = 0;
  local_4c = 0;
  while( true ) {
    if (p[local_4c] == '\0') {
      if (local_50 != 0) {
        __assert_fail("nNested == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x5e,"int *Dau_DsdComputeMatches(char *)");
      }
      return Dau_DsdComputeMatches::pMatches;
    }
    Dau_DsdComputeMatches::pMatches[local_4c] = 0;
    if ((((p[local_4c] == '(') || (p[local_4c] == '[')) || (p[local_4c] == '<')) ||
       (p[local_4c] == '{')) {
      (&nNested)[local_50] = local_4c;
      local_50 = local_50 + 1;
    }
    else if (((p[local_4c] == ')') || (p[local_4c] == ']')) ||
            ((p[local_4c] == '>' || (p[local_4c] == '}')))) {
      local_50 = local_50 + -1;
      Dau_DsdComputeMatches::pMatches[(&nNested)[local_50]] = local_4c;
    }
    if (0xb < local_50) break;
    local_4c = local_4c + 1;
  }
  __assert_fail("nNested < DAU_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                ,0x5c,"int *Dau_DsdComputeMatches(char *)");
}

Assistant:

int * Dau_DsdComputeMatches( char * p )
{
    static int pMatches[DAU_MAX_STR];
    int pNested[DAU_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DAU_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}